

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OstreamSupport.cpp
# Opt level: O2

ostream * operator<<(ostream *out,List<MiniScript::String> *rhs)

{
  String *rhs_00;
  int i;
  long idx;
  
  std::operator<<(out,'[');
  for (idx = 0; (rhs->ls != (ListStorage<MiniScript::String> *)0x0 &&
                (idx < (long)(rhs->ls->super_SimpleVector<MiniScript::String>).mQtyItems));
      idx = idx + 1) {
    if (idx != 0) {
      std::operator<<(out,", ");
    }
    rhs_00 = MiniScript::List<MiniScript::String>::operator[](rhs,idx);
    operator<<(out,rhs_00);
  }
  std::operator<<(out,']');
  return out;
}

Assistant:

ostream & operator<< (ostream &out, const List<String> &rhs) {
	out << '[';
	for (int i=0; i<rhs.Count(); i++) {
		if (i > 0) out << ", ";
		out << rhs[i];
	}
	out << ']';
	return out;
}